

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

UniValue * __thiscall
CRPCTable::dumpArgMap(UniValue *__return_storage_ptr__,CRPCTable *this,JSONRPCRequest *args_request)

{
  pointer pUVar1;
  pointer pcVar2;
  UniValue val;
  bool bVar3;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar4;
  _Base_ptr p_Var5;
  pointer pUVar6;
  long in_FS_OFFSET;
  UniValue result;
  JSONRPCRequest request;
  undefined8 in_stack_fffffffffffffd88;
  _Base_ptr p_Var7;
  VType VVar8;
  undefined4 in_stack_fffffffffffffda4;
  undefined1 *puVar9;
  undefined8 in_stack_fffffffffffffdb0;
  long in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdc0 [32];
  vector<UniValue,_std::allocator<UniValue>_> local_220;
  UniValue local_208;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined8 local_19f;
  undefined4 local_197;
  undefined2 local_193;
  char local_191;
  JSONRPCRequest local_190;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  JSONRPCRequest::JSONRPCRequest(&local_190,args_request);
  local_190.mode = GET_ARGS;
  local_1b0 = &local_1a0;
  __return_storage_ptr__->typ = VARR;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_19f;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_197;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_193;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_191;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_1a8 = 0;
  local_1a0 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var5 = (this->mapCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(this->mapCommands)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var5 != p_Var7) {
    do {
      local_208.val._M_dataplus._M_p = (pointer)&local_208.val.field_2;
      local_208.val._M_string_length = 0;
      local_208.val.field_2._M_local_buf[0] = '\0';
      local_208.typ = VNULL;
      local_208.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_208.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_208.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar3 = ExecuteCommands((vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *)
                              (p_Var5 + 2),&local_190,&local_208);
      if (bVar3) {
        pvVar4 = ::UniValue::getValues(&local_208);
        pUVar1 = (pvVar4->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pUVar6 = (pvVar4->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                      super__Vector_impl_data._M_start; pUVar6 != pUVar1; pUVar6 = pUVar6 + 1) {
          VVar8 = pUVar6->typ;
          pcVar2 = (pUVar6->val)._M_dataplus._M_p;
          puVar9 = &stack0xfffffffffffffdb8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&stack0xfffffffffffffda8,pcVar2,
                     pcVar2 + (pUVar6->val)._M_string_length);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xfffffffffffffdc8,&pUVar6->keys);
          std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_220,&pUVar6->values);
          val.val._M_dataplus._M_p = (pointer)p_Var7;
          val._0_8_ = in_stack_fffffffffffffd88;
          val.val._M_string_length = (size_type)p_Var5;
          val.val.field_2._M_allocated_capacity._0_4_ = VVar8;
          val.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffda4;
          val.val.field_2._8_8_ = puVar9;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffdb0;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffdb8;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)in_stack_fffffffffffffdc0._0_8_;
          val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data =
               (_Vector_base<UniValue,_std::allocator<UniValue>_>)
               (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffdc0._8_24_;
          ::UniValue::push_back(__return_storage_ptr__,val);
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_220);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&stack0xfffffffffffffdc8);
          if (puVar9 != &stack0xfffffffffffffdb8) {
            operator_delete(puVar9,in_stack_fffffffffffffdb8 + 1);
          }
        }
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_208.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_208.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208.val._M_dataplus._M_p != &local_208.val.field_2) {
        operator_delete(local_208.val._M_dataplus._M_p,
                        CONCAT71(local_208.val.field_2._M_allocated_capacity._1_7_,
                                 local_208.val.field_2._M_local_buf[0]) + 1);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
    } while (p_Var5 != p_Var7);
  }
  JSONRPCRequest::~JSONRPCRequest(&local_190);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue CRPCTable::dumpArgMap(const JSONRPCRequest& args_request) const
{
    JSONRPCRequest request = args_request;
    request.mode = JSONRPCRequest::GET_ARGS;

    UniValue ret{UniValue::VARR};
    for (const auto& cmd : mapCommands) {
        UniValue result;
        if (ExecuteCommands(cmd.second, request, result)) {
            for (const auto& values : result.getValues()) {
                ret.push_back(values);
            }
        }
    }
    return ret;
}